

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

void __thiscall helics::apps::Connector::processArgs(Connector *this)

{
  pointer this_00;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *in_RDI;
  undefined4 in_stack_00000038;
  AppFormatMode in_stack_0000003c;
  helicsCLI11App *in_stack_00000040;
  App *in_stack_00000048;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  helicsCLI11App *in_stack_000000f0;
  Connector *in_stack_000001d8;
  allocator<char> local_61 [17];
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  generateParser(in_stack_000001d8);
  if (((ulong)in_RDI[0x10]._M_t.
              super___uniq_ptr_impl<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
              ._M_t.
              super__Tuple_impl<0UL,_helics::helicsCLI11App_*,_std::default_delete<helics::helicsCLI11App>_>
              .super__Head_base<0UL,_helics::helicsCLI11App_*,_false>._M_head_impl & 0x10000) == 0)
  {
    CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
    operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
               0x26154e);
    helicsCLI11App::
    helics_parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
              (in_stack_00000040,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_0000003c,in_stack_00000038));
  }
  else if (((ulong)in_RDI[0x10]._M_t.
                   super___uniq_ptr_impl<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::helicsCLI11App_*,_std::default_delete<helics::helicsCLI11App>_>
                   .super__Head_base<0UL,_helics::helicsCLI11App_*,_false>._M_head_impl &
           0x100000000) != 0) {
    CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
    operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
               0x261583);
    helicsCLI11App::remove_helics_specifics(in_stack_000000f0);
    this_00 = CLI::std::
              unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
              operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                          *)0x261597);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    CLI::App::help(in_stack_00000048,(string *)in_stack_00000040,in_stack_0000003c);
    std::operator<<((ostream *)&std::cout,(string *)&stack0xffffffffffffffc0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::allocator<char>::~allocator(local_61);
  }
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  ~unique_ptr(in_RDI);
  return;
}

Assistant:

void Connector::processArgs()
{
    auto app = generateParser();

    if (!deactivated) {
        app->helics_parse(remArgs);
    } else if (helpMode) {
        app->remove_helics_specifics();
        std::cout << app->help();
    }
}